

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_split_edg(REF_SUBDIV ref_subdiv)

{
  REF_CELL ref_cell;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  REF_STATUS RVar4;
  size_t __size;
  long lVar5;
  int iVar6;
  REF_CELL edg_split;
  REF_INT edge01;
  REF_INT new_cell;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  void *local_130;
  REF_CELL local_128;
  int local_120;
  REF_INT local_11c;
  REF_INT local_118;
  REF_INT local_114;
  REF_INT local_a8;
  REF_INT local_a4 [29];
  
  ref_cell = ref_subdiv->grid->cell[0];
  iVar6 = ref_cell->max;
  if ((long)iVar6 < 0) {
    bVar1 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x553,
           "ref_subdiv_split_edg","malloc marked_for_removal of REF_INT negative");
    __size = 1;
  }
  else {
    __size = (long)iVar6 * 4;
    local_130 = malloc(__size);
    if (local_130 == (void *)0x0) {
      bVar1 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x553,"ref_subdiv_split_edg","malloc marked_for_removal of REF_INT NULL");
      __size = 2;
      local_130 = (void *)0x0;
    }
    else {
      bVar1 = true;
      if (iVar6 != 0) {
        memset(local_130,0,__size);
      }
    }
  }
  uVar3 = (uint)__size;
  if (bVar1) {
    uVar2 = ref_cell_create(&local_128,ref_cell->type);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x555,"ref_subdiv_split_edg",(ulong)uVar2,"temp edg");
      __size = (size_t)uVar2;
    }
    uVar3 = (uint)__size;
    if (uVar2 == 0) {
      if (0 < ref_cell->max) {
        lVar5 = 0;
        do {
          iVar6 = (int)lVar5;
          if (ref_cell->c2n[(long)iVar6 * (long)ref_cell->size_per] != -1) {
            uVar3 = ref_cell_nodes(ref_cell,iVar6,&local_118);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x558,"ref_subdiv_split_edg",(ulong)uVar3,"nodes");
              __size = (size_t)uVar3;
            }
            if (uVar3 != 0) {
              return (REF_STATUS)__size;
            }
            uVar3 = ref_edge_with(ref_subdiv->edge,local_118,local_114,&local_120);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x55a,"ref_subdiv_split_edg",(ulong)uVar3,"e01");
              __size = (size_t)uVar3;
            }
            if (uVar3 != 0) {
              return (REF_STATUS)__size;
            }
            if (ref_subdiv->mark[local_120] != 0) {
              *(undefined4 *)((long)local_130 + lVar5 * 4) = 1;
              uVar3 = ref_cell_nodes(ref_cell,iVar6,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x55e,"ref_subdiv_split_edg",(ulong)uVar3,"nodes");
                __size = (size_t)uVar3;
              }
              if (uVar3 != 0) {
                return (REF_STATUS)__size;
              }
              uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x561,"ref_subdiv_split_edg",(ulong)uVar3,"mis");
                __size = (size_t)uVar3;
              }
              if (uVar3 != 0) {
                return (REF_STATUS)__size;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_11c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x562,"ref_subdiv_split_edg",(ulong)uVar3,"add");
                __size = (size_t)uVar3;
              }
              if (uVar3 != 0) {
                return (REF_STATUS)__size;
              }
              uVar3 = ref_cell_nodes(ref_cell,iVar6,&local_a8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x563,"ref_subdiv_split_edg",(ulong)uVar3,"nodes");
                __size = (size_t)uVar3;
              }
              if (uVar3 != 0) {
                return (REF_STATUS)__size;
              }
              uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,local_a4);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x566,"ref_subdiv_split_edg",(ulong)uVar3,"mis");
                __size = (size_t)uVar3;
              }
              if (uVar3 != 0) {
                return (REF_STATUS)__size;
              }
              uVar3 = ref_cell_add(local_128,&local_a8,&local_11c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x567,"ref_subdiv_split_edg",(ulong)uVar3,"add");
                __size = (size_t)uVar3;
              }
              if (uVar3 != 0) {
                return (REF_STATUS)__size;
              }
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < ref_cell->max);
      }
      if (0 < ref_cell->max) {
        lVar5 = 0;
        do {
          if (*(int *)((long)local_130 + lVar5 * 4) == 1) {
            uVar3 = ref_cell_remove(ref_cell,(REF_INT)lVar5);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x56d,"ref_subdiv_split_edg",(ulong)uVar3,"remove");
              __size = (size_t)uVar3;
            }
            if (uVar3 != 0) {
              return (REF_STATUS)__size;
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < ref_cell->max);
      }
      if (0 < local_128->max) {
        iVar6 = 0;
        do {
          RVar4 = ref_cell_nodes(local_128,iVar6,&local_118);
          if (RVar4 == 0) {
            uVar3 = ref_subdiv_add_local_cell(ref_subdiv,ref_cell,&local_118);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x570,"ref_subdiv_split_edg",(ulong)uVar3,"add local");
              __size = (size_t)uVar3;
            }
            if (uVar3 != 0) {
              return (REF_STATUS)__size;
            }
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < local_128->max);
      }
      uVar3 = ref_cell_free(local_128);
      if (uVar3 == 0) {
        free(local_130);
        uVar3 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x572,"ref_subdiv_split_edg",(ulong)uVar3,"temp edg free");
      }
    }
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_edg(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL edg;
  REF_CELL edg_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT edge01;

  edg = ref_grid_edg(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(edg), REF_INT, 0);

  RSS(ref_cell_create(&edg_split, ref_cell_type(edg)), "temp edg");

  each_ref_cell_valid_cell(edg, cell) {
    RSS(ref_cell_nodes(edg, cell, nodes), "nodes");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[0], nodes[1], &edge01),
        "e01");

    if (ref_subdiv_mark(ref_subdiv, edge01)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(edg, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(edg_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(edg, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(edg_split, new_nodes, &new_cell), "add");
    }
  }

  for (cell = 0; cell < ref_cell_max(edg); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(edg, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(edg_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, edg, nodes), "add local");

  RSS(ref_cell_free(edg_split), "temp edg free");

  free(marked_for_removal);

  return REF_SUCCESS;
}